

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool CombinePSBTs(PartiallySignedTransaction *out,
                 vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
                 *psbtxs)

{
  long lVar1;
  PartiallySignedTransaction *pPVar2;
  bool bVar3;
  PartiallySignedTransaction *psbt;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PartiallySignedTransaction::operator=
            (out,(psbtxs->
                 super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  psbt = (psbtxs->
         super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
         )._M_impl.super__Vector_impl_data._M_start;
  do {
    psbt = psbt + 1;
    pPVar2 = (psbtxs->
             super__Vector_base<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (psbt == pPVar2) break;
    bVar3 = PartiallySignedTransaction::Merge(out,psbt);
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psbt == pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CombinePSBTs(PartiallySignedTransaction& out, const std::vector<PartiallySignedTransaction>& psbtxs)
{
    out = psbtxs[0]; // Copy the first one

    // Merge
    for (auto it = std::next(psbtxs.begin()); it != psbtxs.end(); ++it) {
        if (!out.Merge(*it)) {
            return false;
        }
    }
    return true;
}